

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileTargetGenerator::GenDefFile
          (cmMakefileTargetGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *real_link_commands)

{
  cmGeneratorTarget *this_00;
  cmLocalUnixMakefileGenerator3 *pcVar1;
  cmMakefile *this_01;
  cmLocalCommonGenerator *this_02;
  string_view sVar2;
  bool bVar3;
  ModuleDefinitionInfo *pMVar4;
  string *psVar5;
  reference pbVar6;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *this_03;
  reference ppcVar7;
  ostream *poVar8;
  cmSourceFile *src;
  const_iterator __end1;
  const_iterator __begin1;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__range1;
  string *obj_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  string *obj;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  cmGeneratedFileStream fout;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_200;
  const_iterator local_1f8;
  string_view local_1f0;
  string local_1e0;
  string *local_1c0;
  allocator<char> local_1b1;
  string local_1b0;
  cmValue local_190;
  cmValue nm_executable;
  string local_158;
  undefined1 local_138 [8];
  string objlist_file;
  string local_110;
  string_view local_f0;
  string local_e0;
  string_view local_c0;
  string local_b0;
  string local_90;
  undefined1 local_70 [8];
  string cmd;
  string local_40;
  ModuleDefinitionInfo *local_20;
  ModuleDefinitionInfo *mdi;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *real_link_commands_local;
  cmMakefileTargetGenerator *this_local;
  
  this_00 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  mdi = (ModuleDefinitionInfo *)real_link_commands;
  real_link_commands_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  GetConfigName_abi_cxx11_(&local_40,this);
  pMVar4 = cmGeneratorTarget::GetModuleDefinitionInfo(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if ((pMVar4 != (ModuleDefinitionInfo *)0x0) && ((pMVar4->DefFileGenerated & 1U) != 0)) {
    local_20 = pMVar4;
    psVar5 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    std::__cxx11::string::string((string *)local_70,(string *)psVar5);
    pcVar1 = this->LocalGenerator;
    local_c0 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_70);
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_b0,(cmOutputConverter *)pcVar1,local_c0,SHELL,false);
    pcVar1 = this->LocalGenerator;
    cmOutputConverter::MaybeRelativeToCurBinDir
              (&local_110,(cmOutputConverter *)pcVar1,&local_20->DefFile);
    local_f0 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_110);
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_e0,(cmOutputConverter *)pcVar1,local_f0,SHELL,false);
    objlist_file.field_2._M_local_buf[0xf] = ' ';
    cmStrCat<std::__cxx11::string,char_const(&)[18],std::__cxx11::string,char>
              (&local_90,&local_b0,(char (*) [18])" -E __create_def ",&local_e0,
               objlist_file.field_2._M_local_buf + 0xf);
    std::__cxx11::string::operator=((string *)local_70,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_b0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                   &local_20->DefFile,".objs");
    pcVar1 = this->LocalGenerator;
    cmOutputConverter::MaybeRelativeToCurBinDir
              ((string *)&nm_executable,(cmOutputConverter *)pcVar1,(string *)local_138);
    sVar2 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)&nm_executable);
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_158,(cmOutputConverter *)pcVar1,sVar2,SHELL,false);
    std::__cxx11::string::operator+=((string *)local_70,(string *)&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&nm_executable);
    this_01 = (this->super_cmCommonTargetGenerator).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"CMAKE_NM",&local_1b1);
    local_190 = cmMakefile::GetDefinition(this_01,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::allocator<char>::~allocator(&local_1b1);
    local_1c0 = local_190.Value;
    bVar3 = cmNonempty(local_190);
    if (bVar3) {
      std::__cxx11::string::operator+=((string *)local_70," --nm=");
      this_02 = (this->super_cmCommonTargetGenerator).LocalCommonGenerator;
      psVar5 = cmValue::operator*[abi_cxx11_(&local_190);
      local_1f0 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar5);
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&local_1e0,(cmOutputConverter *)this_02,local_1f0,SHELL,false);
      std::__cxx11::string::operator+=((string *)local_70,(string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_1e0);
    }
    pMVar4 = mdi;
    local_200._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)mdi);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_1f8,&local_200);
    fout._608_8_ = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)pMVar4,local_1f8,(value_type *)local_70);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)&__range2,(string *)local_138,false,None);
    if ((local_20->WindowsExportAllSymbols & 1U) != 0) {
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&this->Objects);
      obj = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(&this->Objects);
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&obj);
        if (!bVar3) break;
        pbVar6 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2);
        sVar2 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)pbVar6);
        bVar3 = cmHasLiteralSuffix<5ul>(sVar2,(char (*) [5])".obj");
        if (bVar3) {
          poVar8 = std::operator<<((ostream *)&__range2,(string *)pbVar6);
          std::operator<<(poVar8,"\n");
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
      __end2_1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(&this->ExternalObjects);
      obj_1 = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(&this->ExternalObjects);
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          (&__end2_1,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&obj_1);
        if (!bVar3) break;
        pbVar6 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2_1);
        poVar8 = std::operator<<((ostream *)&__range2,(string *)pbVar6);
        std::operator<<(poVar8,"\n");
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2_1);
      }
    }
    this_03 = &local_20->Sources;
    __end1 = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                       (this_03);
    src = (cmSourceFile *)
          std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end(this_03);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                                  *)&src);
      if (!bVar3) break;
      ppcVar7 = __gnu_cxx::
                __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                ::operator*(&__end1);
      psVar5 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar7);
      poVar8 = std::operator<<((ostream *)&__range2,(string *)psVar5);
      std::operator<<(poVar8,"\n");
      __gnu_cxx::
      __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
      ::operator++(&__end1);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&__range2);
    std::__cxx11::string::~string((string *)local_138);
    std::__cxx11::string::~string((string *)local_70);
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::GenDefFile(
  std::vector<std::string>& real_link_commands)
{
  cmGeneratorTarget::ModuleDefinitionInfo const* mdi =
    this->GeneratorTarget->GetModuleDefinitionInfo(this->GetConfigName());
  if (!mdi || !mdi->DefFileGenerated) {
    return;
  }
  std::string cmd = cmSystemTools::GetCMakeCommand();
  cmd = cmStrCat(
    this->LocalGenerator->ConvertToOutputFormat(cmd, cmOutputConverter::SHELL),
    " -E __create_def ",
    this->LocalGenerator->ConvertToOutputFormat(
      this->LocalGenerator->MaybeRelativeToCurBinDir(mdi->DefFile),
      cmOutputConverter::SHELL),
    ' ');
  std::string objlist_file = mdi->DefFile + ".objs";
  cmd += this->LocalGenerator->ConvertToOutputFormat(
    this->LocalGenerator->MaybeRelativeToCurBinDir(objlist_file),
    cmOutputConverter::SHELL);
  cmValue const nm_executable = this->Makefile->GetDefinition("CMAKE_NM");
  if (cmNonempty(nm_executable)) {
    cmd += " --nm=";
    cmd += this->LocalCommonGenerator->ConvertToOutputFormat(
      *nm_executable, cmOutputConverter::SHELL);
  }
  real_link_commands.insert(real_link_commands.begin(), cmd);
  // create a list of obj files for the -E __create_def to read
  cmGeneratedFileStream fout(objlist_file);

  if (mdi->WindowsExportAllSymbols) {
    for (std::string const& obj : this->Objects) {
      if (cmHasLiteralSuffix(obj, ".obj")) {
        fout << obj << "\n";
      }
    }
    for (std::string const& obj : this->ExternalObjects) {
      fout << obj << "\n";
    }
  }

  for (cmSourceFile const* src : mdi->Sources) {
    fout << src->GetFullPath() << "\n";
  }
}